

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtCollisionWorld.cpp
# Opt level: O1

bool __thiscall
cbtSingleContactCallback::process(cbtSingleContactCallback *this,cbtBroadphaseProxy *proxy)

{
  cbtCollisionObject *pcVar1;
  ContactResultCallback *pCVar2;
  cbtDispatcher *pcVar3;
  char cVar4;
  int iVar5;
  undefined4 extraout_var;
  cbtCollisionObjectWrapper ob1;
  cbtCollisionObjectWrapper ob0;
  cbtBridgedManifoldResult contactPointResult;
  cbtCollisionObjectWrapper local_c0;
  cbtCollisionObjectWrapper local_98;
  cbtManifoldResult local_70;
  ContactResultCallback *local_38;
  long *plVar6;
  
  pcVar1 = (cbtCollisionObject *)proxy->m_clientObject;
  if (pcVar1 != this->m_collisionObject) {
    cVar4 = (**(code **)(*(long *)this->m_resultCallback + 0x10))
                      (this->m_resultCallback,pcVar1->m_broadphaseHandle);
    if (cVar4 != '\0') {
      local_98.m_collisionObject = this->m_collisionObject;
      local_98.m_shape = (local_98.m_collisionObject)->m_collisionShape;
      local_98.m_parent = (cbtCollisionObjectWrapper *)0x0;
      local_98.m_worldTransform = &(local_98.m_collisionObject)->m_worldTransform;
      local_98.m_partId = -1;
      local_98.m_index = -1;
      local_c0.m_shape = pcVar1->m_collisionShape;
      local_c0.m_parent = (cbtCollisionObjectWrapper *)0x0;
      local_c0.m_worldTransform = &pcVar1->m_worldTransform;
      local_c0.m_partId = -1;
      local_c0.m_index = -1;
      local_c0.m_collisionObject = pcVar1;
      iVar5 = (*this->m_world->m_dispatcher1->_vptr_cbtDispatcher[2])();
      plVar6 = (long *)CONCAT44(extraout_var,iVar5);
      if (plVar6 != (long *)0x0) {
        pCVar2 = this->m_resultCallback;
        cbtManifoldResult::cbtManifoldResult(&local_70,&local_98,&local_c0);
        local_70.super_Result._vptr_Result = (_func_int **)&PTR__Result_00b70120;
        local_38 = pCVar2;
        (**(code **)(*plVar6 + 0x10))
                  (plVar6,&local_98,&local_c0,&this->m_world->m_dispatchInfo,&local_70);
        (**(code **)*plVar6)(plVar6);
        pcVar3 = this->m_world->m_dispatcher1;
        (*pcVar3->_vptr_cbtDispatcher[0xf])(pcVar3,plVar6);
      }
    }
  }
  return true;
}

Assistant:

virtual bool process(const cbtBroadphaseProxy* proxy)
	{
		cbtCollisionObject* collisionObject = (cbtCollisionObject*)proxy->m_clientObject;
		if (collisionObject == m_collisionObject)
			return true;

		//only perform raycast if filterMask matches
		if (m_resultCallback.needsCollision(collisionObject->getBroadphaseHandle()))
		{
			cbtCollisionObjectWrapper ob0(0, m_collisionObject->getCollisionShape(), m_collisionObject, m_collisionObject->getWorldTransform(), -1, -1);
			cbtCollisionObjectWrapper ob1(0, collisionObject->getCollisionShape(), collisionObject, collisionObject->getWorldTransform(), -1, -1);

			cbtCollisionAlgorithm* algorithm = m_world->getDispatcher()->findAlgorithm(&ob0, &ob1, 0, BT_CLOSEST_POINT_ALGORITHMS);
			if (algorithm)
			{
				cbtBridgedManifoldResult contactPointResult(&ob0, &ob1, m_resultCallback);
				//discrete collision detection query

				algorithm->processCollision(&ob0, &ob1, m_world->getDispatchInfo(), &contactPointResult);

				algorithm->~cbtCollisionAlgorithm();
				m_world->getDispatcher()->freeCollisionAlgorithm(algorithm);
			}
		}
		return true;
	}